

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall Minisat::SimpSolver::implied(SimpSolver *this,vec<Minisat::Lit,_int> *c)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  CRef CVar4;
  byte bVar5;
  long lVar6;
  Size local_2c;
  
  if ((this->super_Solver).trail_lim.sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x142,"bool Minisat::SimpSolver::implied(const vec<Lit> &)");
  }
  local_2c = (this->super_Solver).trail.sz;
  vec<int,_int>::push(&(this->super_Solver).trail_lim,&local_2c);
  bVar3 = 0 < c->sz;
  if (0 < c->sz) {
    lVar6 = 0;
    do {
      uVar2 = c->data[lVar6].x;
      if ((this->super_Solver).assigns.
          super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <= (int)uVar2 >> 1
         ) {
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x27,
                      "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                     );
      }
      bVar1 = (this->super_Solver).assigns.
              super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data
              [(int)uVar2 >> 1].value;
      bVar5 = (byte)uVar2 & 1 ^ bVar1;
      if (bVar5 == l_True && (l_True & 2) == 0 || (l_True & 2 & bVar1) != 0) {
        Solver::cancelUntil(&this->super_Solver,0);
        if (bVar3) {
          return true;
        }
        break;
      }
      if ((bVar5 != l_False || (l_False & 2) != 0) && (l_False & 2 & bVar1) == 0) {
        if ((bVar5 != l_Undef || (l_Undef & 2) != 0) && (l_Undef & 2 & bVar1) == 0) {
          __assert_fail("value(c[i]) == l_Undef",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                        ,0x14a,"bool Minisat::SimpSolver::implied(const vec<Lit> &)");
        }
        Solver::uncheckedEnqueue(&this->super_Solver,(Lit)(uVar2 ^ 1),0xffffffff);
      }
      lVar6 = lVar6 + 1;
      bVar3 = lVar6 < c->sz;
    } while (lVar6 < c->sz);
  }
  CVar4 = Solver::propagate(&this->super_Solver);
  Solver::cancelUntil(&this->super_Solver,0);
  return CVar4 != 0xffffffff;
}

Assistant:

bool SimpSolver::implied(const vec<Lit>& c)
{
    assert(decisionLevel() == 0);

    trail_lim.push(trail.size());
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True){
            cancelUntil(0);
            return true;
        }else if (value(c[i]) != l_False){
            assert(value(c[i]) == l_Undef);
            uncheckedEnqueue(~c[i]);
        }

    bool result = propagate() != CRef_Undef;
    cancelUntil(0);
    return result;
}